

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

string * __thiscall
util::make_string<char_const(&)[19],CylHead&,char_const(&)[9],unsigned_char&,char_const(&)[8],int&>
          (string *__return_storage_ptr__,util *this,char (*args) [19],CylHead *args_1,
          char (*args_2) [9],uchar *args_3,char (*args_4) [8],int *args_5)

{
  ostringstream ss;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,(char *)this);
  ::operator<<((ostream *)local_1a8,(CylHead *)args);
  std::operator<<((ostream *)local_1a8,(char *)args_1);
  operator<<((ostream *)local_1a8,(*args_2)[0]);
  std::operator<<((ostream *)local_1a8,(char *)args_3);
  std::ostream::operator<<(local_1a8,*(int *)*args_4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string make_string(Args&& ... args)
{
    std::ostringstream ss;
    (void)std::initializer_list<bool> {(ss << args, false)...};
    return ss.str();
}